

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

SelectUtxosRequestStruct * __thiscall
cfd::js::api::json::SelectUtxosRequest::ConvertToStruct
          (SelectUtxosRequestStruct *__return_storage_ptr__,SelectUtxosRequest *this)

{
  CoinSelectionFeeInformationFieldStruct local_90;
  
  SelectUtxosRequestStruct::SelectUtxosRequestStruct(__return_storage_ptr__);
  core::JsonObjectVector<cfd::js::api::json::UtxoJsonData,_cfd::js::api::UtxoJsonDataStruct>::
  ConvertToStruct((vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
                   *)&local_90,&this->utxos_);
  std::vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>::
  _M_move_assign(&__return_storage_ptr__->utxos,&local_90);
  std::vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>::
  ~vector((vector<cfd::js::api::UtxoJsonDataStruct,_std::allocator<cfd::js::api::UtxoJsonDataStruct>_>
           *)&local_90);
  __return_storage_ptr__->target_amount = this->target_amount_;
  __return_storage_ptr__->is_elements = this->is_elements_;
  core::
  JsonObjectVector<cfd::js::api::json::TargetAmountMapData,_cfd::js::api::TargetAmountMapDataStruct>
  ::ConvertToStruct((vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
                     *)&local_90,&this->targets_);
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::_M_move_assign(&__return_storage_ptr__->targets,&local_90);
  std::
  vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
  ::~vector((vector<cfd::js::api::TargetAmountMapDataStruct,_std::allocator<cfd::js::api::TargetAmountMapDataStruct>_>
             *)&local_90);
  CoinSelectionFeeInformationField::ConvertToStruct(&local_90,&this->fee_info_);
  CoinSelectionFeeInformationFieldStruct::operator=(&__return_storage_ptr__->fee_info,&local_90);
  CoinSelectionFeeInformationFieldStruct::~CoinSelectionFeeInformationFieldStruct(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SelectUtxosRequestStruct SelectUtxosRequest::ConvertToStruct() const {  // NOLINT
  SelectUtxosRequestStruct result;
  result.utxos = utxos_.ConvertToStruct();
  result.target_amount = target_amount_;
  result.is_elements = is_elements_;
  result.targets = targets_.ConvertToStruct();
  result.fee_info = fee_info_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}